

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int array_run_container_xor(array_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  run_container_t *dst_00;
  container_t *pcVar4;
  array_container_t *src_1_00;
  bitset_container_t *src_1_01;
  long lVar5;
  long lVar6;
  uint8_t typecode_after;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  if (src_1->cardinality < 0x20) {
    dst_00 = (run_container_t *)(*global_memory_hook.malloc)(0x10);
    if (dst_00 != (run_container_t *)0x0) {
      dst_00->n_runs = 0;
      dst_00->capacity = 0;
      dst_00->runs = (rle16_t *)0x0;
    }
    array_run_container_lazy_xor(src_1,src_2,dst_00);
    pcVar4 = convert_run_to_efficient_container_and_free(dst_00,&local_21);
    *dst = pcVar4;
    return (uint)local_21;
  }
  uVar2 = croaring_hardware_support();
  if ((uVar2 & 2) == 0) {
    uVar2 = croaring_hardware_support();
    if ((uVar2 & 1) != 0) {
      iVar3 = _avx2_run_container_cardinality(src_2);
      goto LAB_00115275;
    }
    iVar3 = src_2->n_runs;
    lVar5 = (long)iVar3;
    if (0 < lVar5) {
      lVar6 = 0;
      do {
        iVar3 = iVar3 + (uint)src_2->runs[lVar6].length;
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
      goto LAB_00115275;
    }
  }
  else {
    iVar3 = _avx512_run_container_cardinality(src_2);
LAB_00115275:
    if (0x1000 < iVar3) {
      src_1_01 = bitset_container_from_run(src_2);
      _Var1 = bitset_array_container_ixor(src_1_01,src_1,dst);
      goto LAB_001152d5;
    }
  }
  src_1_00 = array_container_from_run(src_2);
  _Var1 = array_array_container_xor(src_1_00,src_1,dst);
  if (src_1_00->array != (uint16_t *)0x0) {
    (*global_memory_hook.free)(src_1_00->array);
    src_1_00->array = (uint16_t *)0x0;
  }
  (*global_memory_hook.free)(src_1_00);
LAB_001152d5:
  return 2 - (uint)_Var1;
}

Assistant:

int array_run_container_xor(const array_container_t *src_1,
                            const run_container_t *src_2, container_t **dst) {
    // semi following Java XOR implementation as of May 2016
    // the C OR implementation works quite differently and can return a run
    // container
    // TODO could optimize for full run containers.

    // use of lazy following Java impl.
    const int arbitrary_threshold = 32;
    if (src_1->cardinality < arbitrary_threshold) {
        run_container_t *ans = run_container_create();
        array_run_container_lazy_xor(src_1, src_2, ans);  // keeps runs.
        uint8_t typecode_after;
        *dst =
            convert_run_to_efficient_container_and_free(ans, &typecode_after);
        return typecode_after;
    }

    int card = run_container_cardinality(src_2);
    if (card <= DEFAULT_MAX_SIZE) {
        // Java implementation works with the array, xoring the run elements via
        // iterator
        array_container_t *temp = array_container_from_run(src_2);
        bool ret_is_bitset = array_array_container_xor(temp, src_1, dst);
        array_container_free(temp);
        return ret_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE;

    } else {  // guess that it will end up as a bitset
        bitset_container_t *result = bitset_container_from_run(src_2);
        bool is_bitset = bitset_array_container_ixor(result, src_1, dst);
        // any necessary type conversion has been done by the ixor
        int retval = (is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
        return retval;
    }
}